

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::UninterpretedOption::MergePartialFromCodedStream
          (UninterpretedOption *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  void *pvVar4;
  double *pdVar5;
  uint8 *puVar6;
  bool bVar7;
  uint32 uVar8;
  pair<int,_int> pVar9;
  int iVar10;
  char *field_name;
  UnknownFieldSet *unknown_fields;
  int byte_limit;
  pointer data;
  char cVar11;
  uint tag;
  ulong uVar12;
  pair<unsigned_long,_bool> pVar13;
  double local_48;
  Type *local_40;
  RepeatedPtrFieldBase *local_38;
  
  this_00 = &this->aggregate_value_;
  this_01 = &this->identifier_value_;
  local_38 = &(this->name_).super_RepeatedPtrFieldBase;
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar8 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001ff15d;
      input->buffer_ = pbVar3 + 1;
      uVar12 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001ff15d:
      uVar8 = io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar12 = 0;
      if (uVar8 - 1 < 0x7f) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar8 | uVar12;
    }
    tag = (uint)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto switchD_001ff1df_default;
    cVar11 = (char)uVar12;
    switch((uint)(uVar12 >> 3) & 0x1fffffff) {
    case 2:
      if (cVar11 != '\x12') break;
      local_40 = internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                           (local_38,(Type *)0x0);
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (byte_limit = (int)(char)*puVar6, -1 < (char)*puVar6)) {
        input->buffer_ = puVar6 + 1;
        bVar7 = true;
      }
      else {
        byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar7 = -1 < byte_limit;
      }
      iVar10 = 6;
      if (bVar7) {
        pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
        iVar10 = 6;
        if (-1 < (long)pVar9) {
          bVar7 = UninterpretedOption_NamePart::MergePartialFromCodedStream(local_40,input);
          iVar10 = 6;
          if (bVar7) {
            bVar7 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar9.first);
            goto LAB_001ff1b4;
          }
        }
      }
      goto LAB_001ff1bd;
    case 3:
      if (cVar11 == '\x1a') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        if ((this->identifier_value_).ptr_ ==
            (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_01,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar7 = internal::WireFormatLite::ReadBytes(input,this_01->ptr_);
        iVar10 = 6;
        if (bVar7) {
          data = (this_01->ptr_->_M_dataplus)._M_p;
          iVar10 = (int)this_01->ptr_->_M_string_length;
          field_name = "google.protobuf.UninterpretedOption.identifier_value";
LAB_001ff3d0:
          internal::WireFormatLite::VerifyUtf8String(data,iVar10,PARSE,field_name);
          goto LAB_001ff1bb;
        }
        goto LAB_001ff1bd;
      }
      break;
    case 4:
      if (cVar11 != ' ') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (-1 < (long)(char)*puVar6)) {
        this->positive_int_value_ = (long)(char)*puVar6;
        input->buffer_ = puVar6 + 1;
      }
      else {
        pVar13 = io::CodedInputStream::ReadVarint64Fallback(input);
        this->positive_int_value_ = pVar13.first;
        iVar10 = 6;
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_001ff1bd;
      }
      goto LAB_001ff1bb;
    case 5:
      if (cVar11 == '(') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        puVar6 = input->buffer_;
        if ((puVar6 < input->buffer_end_) && (uVar2 = *puVar6, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar6 + 1;
          pVar13._8_8_ = 1;
          pVar13.first = (long)(char)uVar2;
        }
        else {
          pVar13 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        iVar10 = 6;
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->negative_int_value_ = pVar13.first;
          goto LAB_001ff1bb;
        }
        goto LAB_001ff1bd;
      }
      break;
    case 6:
      if (cVar11 == '1') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
        pdVar5 = (double *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
          bVar7 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_48);
          if (!bVar7) {
            iVar10 = 6;
            goto LAB_001ff1bd;
          }
        }
        else {
          local_48 = *pdVar5;
          input->buffer_ = (uint8 *)(pdVar5 + 1);
        }
        this->double_value_ = local_48;
        goto LAB_001ff1bb;
      }
      break;
    case 7:
      if (cVar11 != ':') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      if ((this->string_value_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
      {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (&this->string_value_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      }
      bVar7 = internal::WireFormatLite::ReadBytes(input,(this->string_value_).ptr_);
      goto LAB_001ff1b4;
    case 8:
      if (cVar11 == 'B') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        if ((this->aggregate_value_).ptr_ ==
            (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar7 = internal::WireFormatLite::ReadBytes(input,this_00->ptr_);
        iVar10 = 6;
        if (bVar7) {
          data = (this_00->ptr_->_M_dataplus)._M_p;
          iVar10 = (int)this_00->ptr_->_M_string_length;
          field_name = "google.protobuf.UninterpretedOption.aggregate_value";
          goto LAB_001ff3d0;
        }
        goto LAB_001ff1bd;
      }
    }
switchD_001ff1df_default:
    iVar10 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      pvVar4 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar4 & 1) == 0) {
        unknown_fields =
             internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
      }
      bVar7 = internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_001ff1b4:
      iVar10 = 6;
      if (bVar7 != false) {
LAB_001ff1bb:
        iVar10 = 0;
      }
    }
LAB_001ff1bd:
    if (iVar10 != 0) {
      return iVar10 != 6;
    }
  } while( true );
}

Assistant:

bool UninterpretedOption::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.UninterpretedOption)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_name()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string identifier_value = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_identifier_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->identifier_value().data(), this->identifier_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.UninterpretedOption.identifier_value");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint64 positive_int_value = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_positive_int_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &positive_int_value_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int64 negative_int_value = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_negative_int_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &negative_int_value_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional double double_value = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(49u)) {
          set_has_double_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &double_value_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bytes string_value = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_string_value()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string aggregate_value = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_aggregate_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->aggregate_value().data(), this->aggregate_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.UninterpretedOption.aggregate_value");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.UninterpretedOption)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.UninterpretedOption)
  return false;
#undef DO_
}